

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

object * objectRead(FILE *fp)

{
  uint uVar1;
  uint uVar2;
  object *poVar3;
  object *poVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  uint sz;
  int iVar8;
  
  uVar1 = fgetc((FILE *)fp);
  get_byte_offset = get_byte_offset + 1;
  if (uVar1 == 0xffffffff) {
    error_impl("readTag",0x2c0,"Unexpected EOF reading image file: reading tag byte.");
  }
  sz = uVar1 & 0xf;
  if ((uVar1 & 0x10) != 0) {
    if (8 < sz) {
      error_impl("readTag",0x2d2,
                 "readTag(): Error reading image file: tag value field exceeds machine word size.  Image created on another machine? Field size=%d"
                 ,(ulong)sz);
    }
    if (sz == 0) {
      sz = 0;
    }
    else {
      iVar8 = sz << 3;
      iVar6 = 0;
      sz = 0;
      do {
        uVar2 = fgetc((FILE *)fp);
        get_byte_offset = get_byte_offset + 1;
        if (uVar2 == 0xffffffff) {
          error_impl("readTag",0x2d9,"readTag(): Unexpected EOF reading image file!");
        }
        sz = sz | (uVar2 & 0xff) << ((byte)iVar6 & 0x1f);
        iVar6 = iVar6 + 8;
      } while (iVar8 != iVar6);
    }
  }
  switch(uVar1 & 0xe0) {
  case 0:
    poVar3 = (object *)0x0;
    error_impl("objectRead",0x26b,"objectRead(): Read in a NULL object!");
    break;
  case 0x20:
    poVar3 = (object *)((long)&memoryPointer->header + (long)(int)(sz * -8 + -0x10));
    memoryPointer = poVar3;
    if ((long)poVar3 < (long)memoryBase) {
      poVar3 = gcollect(sz);
    }
    else {
      poVar3->header = (ulong)(sz * 4);
    }
    lVar5 = (long)indirtop;
    indirtop = indirtop + 1;
    indirArray[lVar5] = poVar3;
    poVar4 = objectRead(fp);
    poVar3->class = poVar4;
    if (0 < (int)sz) {
      uVar7 = 0;
      do {
        poVar4 = objectRead(fp);
        (&poVar3[1].header)[uVar7] = (uintptr_t)poVar4;
        uVar7 = uVar7 + 1;
      } while (sz != uVar7);
    }
    break;
  case 0x60:
    sz = -sz;
  case 0x40:
    poVar3 = (object *)((long)(int)sz * 2 + 1);
    break;
  case 0x80:
    poVar3 = gcialloc(sz);
    lVar5 = (long)indirtop;
    indirtop = indirtop + 1;
    indirArray[lVar5] = poVar3;
    if (0 < (int)sz) {
      uVar7 = 0;
      do {
        iVar6 = fgetc((FILE *)fp);
        get_byte_offset = get_byte_offset + 1;
        *(char *)((long)&poVar3[1].header + uVar7) = (char)iVar6;
        uVar7 = uVar7 + 1;
      } while (sz != uVar7);
    }
    poVar4 = objectRead(fp);
    poVar3->class = poVar4;
    break;
  case 0xa0:
    if (indirtop < (int)sz) {
      error_impl("objectRead",0x294,"Illegal previous object index %d (max %d)!",(ulong)sz);
    }
    poVar3 = indirArray[(int)sz];
    break;
  case 0xc0:
    poVar3 = *indirArray;
    break;
  case 0xe0:
    poVar3 = (object *)0x0;
    error_impl("objectRead",0x2a0,"Illegal tag type %d!",(ulong)(uVar1 & 0xe0));
  }
  return poVar3;
}

Assistant:

struct object *objectRead(FILE *fp)
{
    int type;
    int size;
    int val;
    int i;
    struct object *newObj=(struct object *)0;
    struct byteObject *bnewObj;

    /* get the tag header for the object, this has a type and value */
    readTag(fp,&type,&val);

    switch(type) {
    case LST_ERROR_TYPE:    /* nil obj */
        error("objectRead(): Read in a NULL object!");

        break;

    case LST_OBJ_TYPE:  /* ordinary object */
        size = val;
        newObj = gcalloc(size);
        indirArray[indirtop++] = newObj;
        newObj->class = objectRead(fp);

        /* get object field values. */
        for (i = 0; i < size; i++) {
            newObj->data[i] = objectRead(fp);
        }

        break;

    case LST_PINT_TYPE: /* positive integer */
        newObj = newInteger(val);
        break;

    case LST_NINT_TYPE: /* negative integer */
        newObj = newInteger(-val);
        break;

    case LST_BARRAY_TYPE:   /* byte arrays */
        size = val;
//        newObj = staticIAllocate(size);
        newObj = gcialloc(size);
        indirArray[indirtop++] = newObj;
        bnewObj = (struct byteObject *) newObj;
        for (i = 0; i < size; i++) {
            /* FIXME check for EOF! */
            bnewObj->bytes[i] = (uint8_t)get_byte(fp);
        }

        bnewObj->class = objectRead(fp);
        break;

    case LST_POBJ_TYPE: /* previous object */
        if(val>indirtop) {
            error("Illegal previous object index %d (max %d)!",val, indirtop);
        }

        newObj = indirArray[val];

        break;

    case LST_NIL_TYPE:  /* object 0 (nil object) */
        newObj = indirArray[0];
        break;

    default:
        error("Illegal tag type %d!",type);
        break;
    }

    return newObj;
}